

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyaddr.c
# Opt level: O2

void ares_gethostbyaddr_nolock
               (ares_channel_t *channel,void *addr,int addrlen,int family,
               ares_host_callback callback,void *arg)

{
  undefined8 uVar1;
  addr_query *aquery;
  char *pcVar2;
  anon_union_16_2_f3fa3043_for_addr *paVar3;
  
  if ((((family & 0xfffffff7U) == 2) && (addrlen == 4 || family != 2)) &&
     (addrlen == 0x10 || family != 10)) {
    aquery = (addr_query *)ares_malloc(0x48);
    if (aquery != (addr_query *)0x0) {
      pcVar2 = ares_strdup(channel->lookups);
      aquery->lookups = pcVar2;
      if (pcVar2 != (char *)0x0) {
        paVar3 = &(aquery->addr).addr;
        aquery->channel = channel;
        if (family == 2) {
          (paVar3->addr4).s_addr = *addr;
        }
        else {
          uVar1 = *(undefined8 *)((long)addr + 8);
          *(undefined8 *)paVar3 = *addr;
          *(undefined8 *)((long)&(aquery->addr).addr + 8) = uVar1;
        }
        (aquery->addr).family = family;
        aquery->callback = callback;
        aquery->arg = arg;
        aquery->remaining_lookups = pcVar2;
        aquery->timeouts = 0;
        next_lookup(aquery);
        return;
      }
      ares_free(aquery);
    }
    (*callback)(arg,0xf,0,(hostent *)0x0);
    return;
  }
  (*callback)(arg,5,0,(hostent *)0x0);
  return;
}

Assistant:

void ares_gethostbyaddr_nolock(ares_channel_t *channel, const void *addr,
                               int addrlen, int family,
                               ares_host_callback callback, void *arg)
{
  struct addr_query *aquery;

  if (family != AF_INET && family != AF_INET6) {
    callback(arg, ARES_ENOTIMP, 0, NULL);
    return;
  }

  if ((family == AF_INET && addrlen != sizeof(aquery->addr.addr.addr4)) ||
      (family == AF_INET6 && addrlen != sizeof(aquery->addr.addr.addr6))) {
    callback(arg, ARES_ENOTIMP, 0, NULL);
    return;
  }

  aquery = ares_malloc(sizeof(struct addr_query));
  if (!aquery) {
    callback(arg, ARES_ENOMEM, 0, NULL);
    return;
  }
  aquery->lookups = ares_strdup(channel->lookups);
  if (aquery->lookups == NULL) {
    /* LCOV_EXCL_START: OutOfMemory */
    ares_free(aquery);
    callback(arg, ARES_ENOMEM, 0, NULL);
    return;
    /* LCOV_EXCL_STOP */
  }
  aquery->channel = channel;
  if (family == AF_INET) {
    memcpy(&aquery->addr.addr.addr4, addr, sizeof(aquery->addr.addr.addr4));
  } else {
    memcpy(&aquery->addr.addr.addr6, addr, sizeof(aquery->addr.addr.addr6));
  }
  aquery->addr.family       = family;
  aquery->callback          = callback;
  aquery->arg               = arg;
  aquery->remaining_lookups = aquery->lookups;
  aquery->timeouts          = 0;

  next_lookup(aquery);
}